

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O0

BigSudokuVisualizer * __thiscall
BigSudokuVisualizer::createCells_abi_cxx11_
          (BigSudokuVisualizer *this,SudokuGitter *gitter1,SudokuGitter *gitter2)

{
  uint uVar1;
  uint uVar2;
  cell cVar3;
  SudokuGitter *in_RCX;
  __cxx11 local_270 [32];
  __cxx11 local_250 [32];
  __cxx11 local_230 [36];
  uint local_20c;
  undefined1 local_208;
  uint local_204;
  uint local_200;
  uint num_3;
  uint col_3;
  uint row_1;
  __cxx11 local_1d8 [32];
  __cxx11 local_1b8 [32];
  uint local_198;
  undefined1 local_194;
  uint local_190;
  uint local_18c;
  uint num_2;
  uint col_1;
  __cxx11 local_168 [32];
  __cxx11 local_148 [36];
  uint local_124;
  undefined1 local_120;
  uint local_11c;
  uint local_118;
  uint num_1;
  uint col_2;
  uint times;
  __cxx11 local_f0 [32];
  __cxx11 local_d0 [36];
  uint local_ac;
  undefined1 local_a8;
  uint local_a4;
  uint local_a0;
  uint num;
  uint col;
  uint row;
  uint counter2;
  uint counter;
  allocator local_69;
  string local_68 [8];
  string colspan;
  allocator local_36;
  byte local_35;
  uint local_34;
  uint local_30;
  uint rowspan_size;
  uint colspan_size;
  uint size;
  SudokuGitter *gitter2_local;
  SudokuGitter *gitter1_local;
  BigSudokuVisualizer *this_local;
  string *cells;
  
  gitter2_local = gitter2;
  gitter1_local = gitter1;
  this_local = this;
  uVar1 = SudokuGitter::getElements(gitter2);
  rowspan_size = uVar1;
  local_30 = SudokuGitter::getQuadWidth(gitter2);
  uVar2 = rowspan_size;
  local_30 = uVar1 - local_30;
  local_34 = SudokuGitter::getQuadHeight(gitter2);
  local_34 = uVar2 - local_34;
  local_35 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_36);
  std::allocator<char>::~allocator((allocator<char> *)&local_36);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::append((char *)local_68);
  std::__cxx11::to_string((__cxx11 *)&counter2,local_30);
  std::__cxx11::string::append(local_68);
  std::__cxx11::string::~string((string *)&counter2);
  std::__cxx11::string::append((char *)local_68);
  row = 0;
  col = 0;
  for (num = 0; num < local_34; num = num + 1) {
    std::__cxx11::string::append((char *)this);
    for (local_a0 = 0; local_a0 < rowspan_size; local_a0 = local_a0 + 1) {
      cVar3 = SudokuGitter::getCell(gitter2,num,local_a0);
      local_ac = cVar3.value;
      local_a8 = cVar3.isStatic;
      local_a4 = local_ac;
      if (local_ac == 0) {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string((__cxx11 *)&col_2,row);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)&col_2);
        std::__cxx11::string::append((char *)this);
      }
      else {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_d0,row);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_f0,local_a4);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_f0);
        std::__cxx11::string::append((char *)this);
      }
      row = row + 1;
    }
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::append((char *)this);
  }
  for (num_1 = 0; uVar2 = num_1, uVar1 = SudokuGitter::getQuadHeight(gitter2), uVar2 < uVar1;
      num_1 = num_1 + 1) {
    std::__cxx11::string::append((char *)this);
    for (local_118 = 0; local_118 < rowspan_size; local_118 = local_118 + 1) {
      cVar3 = SudokuGitter::getCell(gitter2,num_1 + local_34,local_118);
      local_124 = cVar3.value;
      local_120 = cVar3.isStatic;
      local_11c = local_124;
      if (local_124 == 0) {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string((__cxx11 *)&num_2,row);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)&num_2);
        std::__cxx11::string::append((char *)this);
      }
      else {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_148,row);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_168,local_11c);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::append((char *)this);
      }
      row = row + 1;
    }
    uVar2 = SudokuGitter::getQuadWidth(in_RCX);
    col = col + uVar2;
    local_18c = SudokuGitter::getQuadWidth(in_RCX);
    if (local_18c == rowspan_size) {
      local_18c = local_18c - 1;
    }
    for (; local_18c < rowspan_size; local_18c = local_18c + 1) {
      cVar3 = SudokuGitter::getCell(in_RCX,num_1,local_18c);
      local_198 = cVar3.value;
      local_194 = cVar3.isStatic;
      local_190 = local_198;
      if (local_198 == 0) {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string((__cxx11 *)&col_3,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)&col_3);
        std::__cxx11::string::append((char *)this);
      }
      else {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_1b8,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_1b8);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_1d8,local_190);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::string::append((char *)this);
      }
      col = col + 1;
    }
    std::__cxx11::string::append((char *)this);
  }
  for (num_3 = SudokuGitter::getQuadHeight(in_RCX); num_3 < rowspan_size; num_3 = num_3 + 1) {
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::append((string *)this);
    for (local_200 = 0; local_200 < rowspan_size; local_200 = local_200 + 1) {
      cVar3 = SudokuGitter::getCell(in_RCX,num_3,local_200);
      local_20c = cVar3.value;
      local_208 = cVar3.isStatic;
      local_204 = local_20c;
      if (local_20c == 0) {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_270,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_270);
        std::__cxx11::string::append((char *)this);
      }
      else {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_230,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_230);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_250,local_204);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_250);
        std::__cxx11::string::append((char *)this);
      }
      col = col + 1;
    }
    std::__cxx11::string::append((char *)this);
  }
  local_35 = 1;
  std::__cxx11::string::~string(local_68);
  if ((local_35 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

const std::string BigSudokuVisualizer::createCells(SudokuGitter gitter1, SudokuGitter gitter2) {
    unsigned int size = gitter1.getElements();
    unsigned int colspan_size = size - gitter1.getQuadWidth();
    unsigned int rowspan_size = size - gitter1.getQuadHeight();

    std::string cells = "";
    std::string colspan = "";
    colspan.append("<td style='border: none' colspan='");
    colspan.append(std::to_string(colspan_size));
    colspan.append("'></td>");

    unsigned int counter = 0;
    unsigned int counter2 = 0;
    for (unsigned int row = 0; row < rowspan_size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append(colspan);
        cells.append("</tr>");
    }

    for(unsigned int times = 0; times < gitter1.getQuadHeight(); times++){
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter1.getCell(times + rowspan_size, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        counter2 += gitter2.getQuadWidth();
        unsigned int col = gitter2.getQuadWidth();
        if(col == size){
            col--;
        }
        for (col; col < size; col++) {
            unsigned int num = gitter2.getCell(times, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    for (unsigned int row = gitter2.getQuadHeight(); row < size; row++) {
        cells.append("<tr>");
        cells.append(colspan);
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter2.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='bigCell-");
                cells.append(std::to_string(counter2));
                cells.append("' type='text'></td>");
            }
            counter2++;
        }
        cells.append("</tr>");
    }
    return cells;
}